

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

void record_render_passes(StateRecorder *recorder)

{
  bool bVar1;
  VkRenderPassMultiviewCreateInfo blank_multiview;
  VkSubpassDescription subpasses [2];
  undefined8 local_2a8;
  undefined4 local_2a0;
  VkRenderPassCreateInfo local_298;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined8 *puStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  undefined1 local_188 [32];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  uint32_t *puStack_130;
  undefined8 local_128;
  int32_t *piStack_120;
  undefined8 local_118;
  uint32_t *local_110;
  undefined1 local_108 [40];
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  VkSubpassDescription local_b8;
  undefined8 local_6c;
  VkAttachmentReference *local_60;
  undefined4 local_58;
  VkAttachmentReference *local_50;
  
  local_298.pNext = (void *)0x0;
  local_298.subpassCount = 0;
  local_298._36_4_ = 0;
  local_298.pSubpasses = (VkSubpassDescription *)0x0;
  local_298.flags = 0;
  local_298.attachmentCount = 0;
  local_298.pAttachments = (VkAttachmentDescription *)0x0;
  local_298._48_8_ = 0;
  local_298.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_298._4_4_ = 0;
  memset(&local_b8,0,0x90);
  local_298.pAttachments = (VkAttachmentDescription *)local_108;
  uStack_e0 = 0;
  local_c8 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_298.pDependencies = (VkSubpassDependency *)local_188;
  local_188._0_4_ = 9;
  local_188._4_4_ = 0x13;
  local_188._8_4_ = 10;
  local_188._12_4_ = 199;
  local_158 = 0x13000001ea;
  local_188._16_4_ = 0x22;
  local_188._20_4_ = 0x31;
  local_188._24_8_ = 0x5a00000001;
  local_168 = 0x64000000be;
  uStack_160 = 0x154000007c6;
  local_108._0_4_ = 0x28;
  local_108._4_4_ = VK_FORMAT_R16G16_SFLOAT;
  local_108._32_8_ = 2;
  local_108._28_4_ = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  local_108._12_4_ = VK_ATTACHMENT_LOAD_OP_LOAD;
  local_108._16_4_ = VK_ATTACHMENT_STORE_OP_STORE;
  local_108._20_4_ = VK_ATTACHMENT_LOAD_OP_LOAD;
  local_108._24_4_ = VK_ATTACHMENT_STORE_OP_STORE;
  local_108._8_4_ = VK_SAMPLE_COUNT_16_BIT;
  local_b8.preserveAttachmentCount = 4;
  local_b8.pPreserveAttachments = record_render_passes::preserves;
  local_b8.inputAttachmentCount = 2;
  local_b8.pInputAttachments = record_render_passes::inputs;
  local_b8.colorAttachmentCount = 2;
  local_b8.pColorAttachments = record_render_passes::colors;
  local_b8.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_b8.pDepthStencilAttachment = &record_render_passes::ds;
  local_b8.pResolveAttachments = record_render_passes::resolves;
  local_60 = record_render_passes::inputs;
  local_58 = 2;
  local_50 = record_render_passes::colors;
  local_6c = 0x100000000;
  local_298.flags = 8;
  local_298.attachmentCount = 2;
  local_298.subpassCount = 2;
  local_298._48_8_ = local_298._48_8_ & 0xffffffff00000000;
  local_298.pNext = &local_148;
  uStack_140 = 0;
  local_148 = 0x3b9b9908;
  local_138 = 3;
  puStack_130 = record_render_passes::view_masks;
  local_128 = 2;
  piStack_120 = record_render_passes::view_offsets;
  local_118 = 4;
  local_110 = record_render_passes::correlation_masks;
  local_298.pSubpasses = &local_b8;
  bVar1 = Fossilize::StateRecorder::record_render_pass
                    (recorder,(VkRenderPass)&DAT_00007530,&local_298,0);
  if (bVar1) {
    local_298._48_8_ = local_298._48_8_ & 0xffffffff00000000;
    local_298.pNext = &local_1f8;
    puStack_1f0 = (undefined8 *)0x0;
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1f8 = 0x3b9b9908;
    bVar1 = Fossilize::StateRecorder::record_render_pass
                      (recorder,(VkRenderPass)&DAT_00007531,&local_298,0);
    if (bVar1) {
      puStack_1f0 = &local_218;
      local_218 = 0x3b9c9309;
      uStack_210 = 0;
      local_2a8 = 0;
      local_2a0 = 1;
      local_208 = 1;
      local_200 = (undefined1 *)&local_2a8;
      bVar1 = Fossilize::StateRecorder::record_render_pass
                        (recorder,(VkRenderPass)&DAT_00007532,&local_298,0);
      if (bVar1) {
        local_298.pNext = &local_238;
        local_238 = 0x3b9e1d92;
        uStack_230 = 0;
        local_228 = 0x3b9e1d9000000005;
        bVar1 = Fossilize::StateRecorder::record_render_pass
                          (recorder,(VkRenderPass)&DAT_00007533,&local_298,0);
        if (bVar1) {
          local_298.pNext = &local_1b8;
          uStack_1b0 = 0;
          local_1b8 = 0x3b9cf898;
          local_1a8 = 0x900000002;
          uStack_1a0 = 0x30000000e;
          local_198 = &local_258;
          local_258 = 0x3e99999a3e4ccccd;
          uStack_250 = 0x3e4ccccd3ecccccd;
          local_248 = 0x3dcccccd3f4ccccd;
          bVar1 = Fossilize::StateRecorder::record_render_pass
                            (recorder,(VkRenderPass)&DAT_00007534,&local_298,0);
          if (bVar1) {
            return;
          }
        }
      }
    }
  }
  abort();
}

Assistant:

static void record_render_passes(StateRecorder &recorder)
{
	VkRenderPassCreateInfo pass = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO };
	VkSubpassDependency deps[2] = {};
	VkSubpassDescription subpasses[2] = {};
	VkAttachmentDescription att[2] = {};

	pass.flags = 8;

	deps[0].dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
	deps[0].dstAccessMask = 49;
	deps[0].srcAccessMask = 34;
	deps[0].dstStageMask = 199;
	deps[0].srcStageMask = 10;
	deps[0].srcSubpass = 9;
	deps[0].dstSubpass = 19;
	deps[1].dependencyFlags = 19;
	deps[1].dstAccessMask = 490;
	deps[1].srcAccessMask = 340;
	deps[1].dstStageMask = 1990;
	deps[1].srcStageMask = 100;
	deps[1].srcSubpass = 90;
	deps[1].dstSubpass = 190;

	att[0].flags = 40;
	att[0].format = VK_FORMAT_R16G16_SFLOAT;
	att[0].finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
	att[0].initialLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
	att[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].samples = VK_SAMPLE_COUNT_16_BIT;

	static const uint32_t preserves[4] = { 9, 4, 2, 3 };
	static const VkAttachmentReference inputs[2] = { { 3, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 9, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference colors[2] = { { 8, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 1, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference resolves[2] = { { 1, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL }, { 3, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL } };
	static const VkAttachmentReference ds = { 0, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL };
	subpasses[0].preserveAttachmentCount = 4;
	subpasses[0].pPreserveAttachments = preserves;
	subpasses[0].inputAttachmentCount = 2;
	subpasses[0].pInputAttachments = inputs;
	subpasses[0].colorAttachmentCount = 2;
	subpasses[0].pColorAttachments = colors;
	subpasses[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
	subpasses[0].pDepthStencilAttachment = &ds;
	subpasses[0].pResolveAttachments = resolves;

	subpasses[1].inputAttachmentCount = 1;
	subpasses[1].pInputAttachments = inputs;
	subpasses[1].colorAttachmentCount = 2;
	subpasses[1].pColorAttachments = colors;
	subpasses[1].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

	pass.attachmentCount = 2;
	pass.pAttachments = att;
	pass.subpassCount = 2;
	pass.pSubpasses = subpasses;
	pass.dependencyCount = 0;
	pass.pDependencies = deps;

	VkRenderPassMultiviewCreateInfo multiview = { VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO };
	multiview.subpassCount = 3;
	static const uint32_t view_masks[3] = { 2, 4, 5 };
	multiview.pViewMasks = view_masks;
	multiview.dependencyCount = 2;
	static const int32_t view_offsets[2] = { -2, 1 };
	multiview.pViewOffsets = view_offsets;
	multiview.correlationMaskCount = 4;
	static const uint32_t correlation_masks[4] = { 1, 2, 3, 4 };
	multiview.pCorrelationMasks = correlation_masks;
	pass.pNext = &multiview;

	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30000), pass))
		abort();

	pass.dependencyCount = 0;
	VkRenderPassMultiviewCreateInfo blank_multiview = { VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO };
	pass.pNext = &blank_multiview;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30001), pass))
		abort();

	VkRenderPassInputAttachmentAspectCreateInfo input_att_aspect = { VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO };
	VkInputAttachmentAspectReference aspects[1] = { };
	aspects[0].subpass = 0;
	aspects[0].inputAttachmentIndex = 0;
	aspects[0].aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
	input_att_aspect.aspectReferenceCount = 1;
	input_att_aspect.pAspectReferences = aspects;
	blank_multiview.pNext = &input_att_aspect;

	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30002), pass))
		abort();

	VkRenderPassFragmentDensityMapCreateInfoEXT density_map =
			{ VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT };
	density_map.fragmentDensityMapAttachment.attachment = 5;
	density_map.fragmentDensityMapAttachment.layout = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
	pass.pNext = &density_map;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30003), pass))
		abort();

	VkSampleLocationsInfoEXT loc_info =
			{ VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT };
	loc_info.sampleLocationGridSize.width = 9;
	loc_info.sampleLocationGridSize.height = 14;
	loc_info.sampleLocationsPerPixel = VK_SAMPLE_COUNT_2_BIT;
	loc_info.sampleLocationsCount = 3;
	VkSampleLocationEXT sample_locs[3];
	loc_info.pSampleLocations = sample_locs;
	sample_locs[0].x = 0.2f;
	sample_locs[0].y = 0.3f;
	sample_locs[1].x = 0.4f;
	sample_locs[1].y = 0.2f;
	sample_locs[2].x = 0.8f;
	sample_locs[2].y = 0.1f;
	pass.pNext = &loc_info;
	if (!recorder.record_render_pass(fake_handle<VkRenderPass>(30004), pass))
		abort();
}